

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QXmlStreamPrivateTagStack::NamespaceDeclaration>::copyAppend
          (QGenericArrayOps<QXmlStreamPrivateTagStack::NamespaceDeclaration> *this,
          NamespaceDeclaration *b,NamespaceDeclaration *e)

{
  qsizetype *pqVar1;
  NamespaceDeclaration *pNVar2;
  long lVar3;
  QString *pQVar4;
  qsizetype qVar5;
  qsizetype qVar6;
  QString *pQVar7;
  qsizetype qVar8;
  
  if (b != e) {
    pNVar2 = (this->super_QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration>).ptr;
    for (; b < e; b = b + 1) {
      lVar3 = (this->super_QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration>).size;
      pQVar4 = (b->prefix).m_string;
      qVar5 = (b->prefix).m_pos;
      qVar6 = (b->prefix).m_size;
      pQVar7 = (b->namespaceUri).m_string;
      qVar8 = (b->namespaceUri).m_size;
      pqVar1 = &pNVar2[lVar3].namespaceUri.m_pos;
      *pqVar1 = (b->namespaceUri).m_pos;
      pqVar1[1] = qVar8;
      pqVar1 = &pNVar2[lVar3].prefix.m_size;
      *pqVar1 = qVar6;
      pqVar1[1] = (qsizetype)pQVar7;
      pNVar2[lVar3].prefix.m_string = pQVar4;
      pNVar2[lVar3].prefix.m_pos = qVar5;
      pqVar1 = &(this->super_QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration>).
                size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }